

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCode.hpp
# Opt level: O0

void __thiscall
bytecode::CompiledFile::CompiledFile
          (CompiledFile *this,Function *entrypoint,
          vector<bytecode::Function,_std::allocator<bytecode::Function>_> *functions,
          vector<bytecode::ObjectConstructor,_std::allocator<bytecode::ObjectConstructor>_> *objects
          ,vector<long,_std::allocator<long>_> *intConstants,
          vector<double,_std::allocator<double>_> *floatConstants,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *stringConstants)

{
  vector<double,_std::allocator<double>_> *floatConstants_local;
  vector<long,_std::allocator<long>_> *intConstants_local;
  vector<bytecode::ObjectConstructor,_std::allocator<bytecode::ObjectConstructor>_> *objects_local;
  vector<bytecode::Function,_std::allocator<bytecode::Function>_> *functions_local;
  Function *entrypoint_local;
  CompiledFile *this_local;
  
  Function::Function(&this->entrypoint,entrypoint);
  std::vector<bytecode::Function,_std::allocator<bytecode::Function>_>::vector
            (&this->functions,functions);
  std::vector<bytecode::ObjectConstructor,_std::allocator<bytecode::ObjectConstructor>_>::vector
            (&this->objects,objects);
  std::vector<long,_std::allocator<long>_>::vector(&this->intConstants,intConstants);
  std::vector<double,_std::allocator<double>_>::vector(&this->floatConstants,floatConstants);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->stringConstants,stringConstants);
  return;
}

Assistant:

explicit CompiledFile(
    Function entrypoint,
    std::vector<Function> functions,
    std::vector<ObjectConstructor> objects,
    std::vector<std::int64_t> intConstants,
    std::vector<double> floatConstants,
    std::vector<std::string> stringConstants
  ) noexcept
  : entrypoint{std::move(entrypoint)}
  , functions{std::move(functions)}
  , objects{std::move(objects)}
  , intConstants{std::move(intConstants)}
  , floatConstants{std::move(floatConstants)}
  , stringConstants{std::move(stringConstants)}
  {}